

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction_common.cpp
# Opt level: O2

void __thiscall cfd::UtxoData::UtxoData(UtxoData *this,UtxoData *object)

{
  undefined7 uVar1;
  
  this->block_height = 0;
  core::BlockHash::BlockHash(&this->block_hash);
  cfd::core::Txid::Txid(&this->txid);
  this->vout = 0;
  cfd::core::Script::Script(&this->locking_script);
  cfd::core::Script::Script(&this->redeem_script);
  cfd::core::Address::Address(&this->address);
  (this->descriptor)._M_dataplus._M_p = (pointer)&(this->descriptor).field_2;
  (this->descriptor)._M_string_length = 0;
  (this->descriptor).field_2._M_local_buf[0] = '\0';
  cfd::core::Amount::Amount(&this->amount);
  this->address_type = kP2shAddress;
  this->binary_data = (void *)0x0;
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&this->asset);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress(&this->confidential_address);
  cfd::core::BlindFactor::BlindFactor(&this->asset_blind_factor);
  cfd::core::BlindFactor::BlindFactor(&this->amount_blind_factor);
  cfd::core::ConfidentialValue::ConfidentialValue(&this->value_commitment);
  cfd::core::Script::Script(&this->scriptsig_template);
  this->block_height = object->block_height;
  cfd::core::BlockHash::operator=(&this->block_hash,&object->block_hash);
  cfd::core::Txid::operator=(&this->txid,&object->txid);
  this->vout = object->vout;
  cfd::core::Script::operator=(&this->locking_script,&object->locking_script);
  cfd::core::Script::operator=(&this->redeem_script,&object->redeem_script);
  cfd::core::Address::operator=(&this->address,&object->address);
  std::__cxx11::string::_M_assign((string *)&this->descriptor);
  this->field_0x260 = object->field_0x260;
  uVar1 = *(undefined7 *)&object->field_0x259;
  this->amount = object->amount;
  *(undefined7 *)&this->field_0x259 = uVar1;
  this->address_type = object->address_type;
  this->binary_data = object->binary_data;
  cfd::core::ConfidentialAssetId::operator=(&this->asset,&object->asset);
  cfd::core::ElementsConfidentialAddress::operator=
            (&this->confidential_address,&object->confidential_address);
  cfd::core::BlindFactor::operator=(&this->asset_blind_factor,&object->asset_blind_factor);
  cfd::core::BlindFactor::operator=(&this->amount_blind_factor,&object->amount_blind_factor);
  cfd::core::ConfidentialValue::operator=(&this->value_commitment,&object->value_commitment);
  cfd::core::Script::operator=(&this->scriptsig_template,&object->scriptsig_template);
  return;
}

Assistant:

UtxoData::UtxoData(const UtxoData& object) {
  block_height = object.block_height;
  block_hash = object.block_hash;
  txid = object.txid;
  vout = object.vout;
  locking_script = object.locking_script;
  redeem_script = object.redeem_script;
  address = object.address;
  descriptor = object.descriptor;
  amount = object.amount;
  address_type = object.address_type;
  binary_data = object.binary_data;
#ifndef CFD_DISABLE_ELEMENTS
  asset = object.asset;
  confidential_address = object.confidential_address;
  asset_blind_factor = object.asset_blind_factor;
  amount_blind_factor = object.amount_blind_factor;
  value_commitment = object.value_commitment;
#endif  // CFD_DISABLE_ELEMENTS
  scriptsig_template = object.scriptsig_template;
}